

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O1

void __thiscall
SQOuterVar::SQOuterVar(SQOuterVar *this,SQObjectPtr *name,SQObjectPtr *src,SQOuterType t)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_name).super_SQObject._type = OT_NULL;
  (this->_src).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_src).super_SQObject._type = OT_NULL;
  (this->_name).super_SQObject._unVal = (name->super_SQObject)._unVal;
  SVar2 = (name->super_SQObject)._type;
  (this->_name).super_SQObject._type = SVar2;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(((this->_name).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SVar2 = (this->_src).super_SQObject._type;
  pSVar4 = (this->_src).super_SQObject._unVal.pTable;
  (this->_src).super_SQObject._unVal = (src->super_SQObject)._unVal;
  SVar3 = (src->super_SQObject)._type;
  (this->_src).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((this->_src).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_type = t;
  return;
}

Assistant:

SQOuterVar(const SQObjectPtr &name,const SQObjectPtr &src,SQOuterType t)
    {
        _name = name;
        _src=src;
        _type=t;
    }